

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O0

int sprkStep_Resize(ARKodeMem ark_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                   ARKVecResizeFn resize,void *resize_data)

{
  int iVar1;
  ARKodeMem ark_mem_00;
  ARKVecResizeFn resize_00;
  long in_RSI;
  ARKodeMem in_RDI;
  int retval;
  sunindextype liw_diff;
  sunindextype lrw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  ARKodeSPRKStepMem step_mem;
  ARKodeSPRKStepMem *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  long local_50;
  long local_48;
  N_Vector *v;
  int local_4;
  
  v = (N_Vector *)0x0;
  local_4 = sprkStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (local_4 == 0) {
    local_50 = 0;
    local_48 = 0;
    if (*(long *)(*(long *)(in_RSI + 8) + 0x20) != 0) {
      N_VSpace(in_RSI,&local_48,&local_50);
    }
    ark_mem_00 = (ARKodeMem)(local_48 - in_RDI->lrw1);
    resize_00 = (ARKVecResizeFn)(local_50 - in_RDI->liw1);
    in_RDI->lrw1 = local_48;
    in_RDI->liw1 = local_50;
    iVar1 = arkResizeVec(ark_mem_00,resize_00,(void *)CONCAT44(local_4,in_stack_ffffffffffffff98),
                         (sunindextype)in_stack_ffffffffffffff90,(sunindextype)(v + 2),
                         (N_Vector)0x198b7f,v);
    if (iVar1 == 0) {
      arkProcessError(in_RDI,-0x14,0x108,"sprkStep_Resize",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                      ,"Unable to resize vector");
      local_4 = -0x14;
    }
    else {
      if (v[3] != (N_Vector)0x0) {
        iVar1 = arkResizeVec(ark_mem_00,resize_00,
                             (void *)CONCAT44(local_4,in_stack_ffffffffffffff98),
                             (sunindextype)in_stack_ffffffffffffff90,(sunindextype)(v + 3),
                             (N_Vector)0x198bf8,v);
        if (iVar1 == 0) {
          arkProcessError(in_RDI,-0x14,0x112,"sprkStep_Resize",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                          ,"Unable to resize vector");
          return -0x14;
        }
        N_VConst(0,v[3]);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int sprkStep_Resize(ARKodeMem ark_mem, N_Vector y0,
                    SUNDIALS_MAYBE_UNUSED sunrealtype hscale,
                    SUNDIALS_MAYBE_UNUSED sunrealtype t0, ARKVecResizeFn resize,
                    void* resize_data)
{
  ARKodeSPRKStepMem step_mem = NULL;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Determine change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize the local vectors */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &step_mem->sdata))
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Unable to resize vector");
    return (ARK_MEM_FAIL);
  }

  if (step_mem->yerr)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->yerr))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
    /* Zero yerr for compensated summation */
    N_VConst(ZERO, step_mem->yerr);
  }

  return (ARK_SUCCESS);
}